

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticVersion.cpp
# Opt level: O0

bool beast::isNumeric(string *s)

{
  bool bVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int n;
  string *s_local;
  
  psStack_18 = s;
  std::__cxx11::string::string((string *)&local_40,(string *)s);
  bVar1 = lexicalCastChecked<int,std::__cxx11::string>(&local_1c,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::__cxx11::to_string(&local_70,local_1c);
    s_local._7_1_ =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         psStack_18);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    s_local._7_1_ = 0;
  }
  return (bool)(s_local._7_1_ & 1);
}

Assistant:

bool isNumeric (std::string const& s)
{
    int n;

    // Must be convertible to an integer
    if (!lexicalCastChecked (n, s))
        return false;

    // Must not have leading zeroes
    return std::to_string (n) == s;
}